

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.hpp
# Opt level: O2

tuple<std::vector<double,_std::allocator<double>_>_> * __thiscall
njoy::ENDFtk::record::Zipper::
unzip<njoy::ENDFtk::record::Real,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (tuple<std::vector<double,_std::allocator<double>_>_> *__return_storage_ptr__,Zipper *this
          ,uint64_t nEntries,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  ulong uVar1;
  int iVar2;
  tuple<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  iterators;
  
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_>).
  super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_>).
  super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_>).
  super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,(size_type)this);
  iterators.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  ._M_head_impl._M_current =
       (_Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
        )(__return_storage_ptr__->
         super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_>).
         super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
  uVar1 = (ulong)this / 6;
  while (iVar2 = (int)uVar1, uVar1 = (ulong)(iVar2 - 1), iVar2 != 0) {
    readLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Real>,std::tuple<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&iterators,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)nEntries,it,(long *)end,(int)lineNumber,MAT,MF);
    iterators.
    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
    .
    super__Head_base<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
    ._M_head_impl._M_current =
         (_Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
          )((long)iterators.
                  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                  .
                  super__Head_base<0UL,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                  ._M_head_impl._M_current + 0x30);
  }
  if ((ulong)this % 6 != 0) {
    readPartialLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Real>,std::tuple<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,0ul>
              ((ulong)this % 6,&iterators,nEntries,it,end,(ulong)lineNumber & 0xffffffff,MAT,MF);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::tuple< std::vector< typename ENDFTypes::Type >... >
unzip
( uint64_t nEntries,
  Iterator& it, const Iterator& end, long& lineNumber,
  int MAT, int MF, int MT ){
    
  std::tuple< std::vector< typename ENDFTypes::Type >... > result;    
  reserve( nEntries, result );

  using Zip = Zipped< ENDFTypes... >;
  auto iterators = makeIteratorTuple( result, Zip::tupleIndices );

  int remainingLines = nEntries / Zip::tuplesPerRecord;
  while ( remainingLines-- ){
    readLine< Zip >( iterators, it, end, lineNumber, MAT, MF, MT );
    increment< Zip >( iterators );
  }
    
  const int remainingEntries = nEntries % Zip::tuplesPerRecord;
  if ( remainingEntries ){
    readPartialLine< Zip >
      ( remainingEntries, iterators, it, end, lineNumber,
        MAT, MF, MT, Zip::tupleIndices );
  }
    
  return result;
}